

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_setBasePrices(optState_t *optPtr,int optLevel)

{
  int iVar1;
  U32 UVar2;
  uint uVar3;
  
  if (optPtr->literalCompressionMode != ZSTD_ps_disable) {
    if (optLevel == 0) {
      uVar3 = optPtr->litSum + 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      UVar2 = iVar1 << 8;
    }
    else {
      UVar2 = ZSTD_fracWeight(optPtr->litSum);
    }
    optPtr->litSumBasePrice = UVar2;
  }
  if (optLevel == 0) {
    uVar3 = optPtr->litLengthSum + 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    optPtr->litLengthSumBasePrice = iVar1 << 8;
    uVar3 = optPtr->matchLengthSum + 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    optPtr->matchLengthSumBasePrice = iVar1 << 8;
    uVar3 = optPtr->offCodeSum + 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    UVar2 = iVar1 << 8;
  }
  else {
    UVar2 = ZSTD_fracWeight(optPtr->litLengthSum);
    optPtr->litLengthSumBasePrice = UVar2;
    UVar2 = ZSTD_fracWeight(optPtr->matchLengthSum);
    optPtr->matchLengthSumBasePrice = UVar2;
    UVar2 = ZSTD_fracWeight(optPtr->offCodeSum);
  }
  optPtr->offCodeSumBasePrice = UVar2;
  return;
}

Assistant:

static void ZSTD_setBasePrices(optState_t* optPtr, int optLevel)
{
    if (ZSTD_compressedLiterals(optPtr))
        optPtr->litSumBasePrice = WEIGHT(optPtr->litSum, optLevel);
    optPtr->litLengthSumBasePrice = WEIGHT(optPtr->litLengthSum, optLevel);
    optPtr->matchLengthSumBasePrice = WEIGHT(optPtr->matchLengthSum, optLevel);
    optPtr->offCodeSumBasePrice = WEIGHT(optPtr->offCodeSum, optLevel);
}